

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_image *
rf_gen_image_color_to_buffer
          (rf_image *__return_storage_ptr__,int width,int height,rf_color color,rf_color *dst,
          rf_int dst_size)

{
  long lVar1;
  
  lVar1 = 0;
  if (dst_size < 1) {
    dst_size = lVar1;
  }
  for (; dst_size != lVar1; lVar1 = lVar1 + 1) {
    dst[lVar1] = color;
  }
  __return_storage_ptr__->data = dst;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->format = RF_UNCOMPRESSED_R8G8B8A8;
  __return_storage_ptr__->valid = true;
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_gen_image_color_to_buffer(int width, int height, rf_color color, rf_color* dst, rf_int dst_size)
{
    rf_image result = {0};

    for (rf_int i = 0; i < dst_size; i++)
    {
        dst[i] = color;
    }

    return (rf_image) {
        .data   = dst,
        .width  = width,
        .height = height,
        .format = RF_UNCOMPRESSED_R8G8B8A8,
        .valid  = true,
    };
}